

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::RandSeqProductionSymbol::serializeTo::anon_class_8_1_79d3bf50::operator()
          (anon_class_8_1_79d3bf50 *this,string_view propName,ProdItem *item)

{
  string_view name;
  string_view name_00;
  bool bVar1;
  long in_RCX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDI;
  Expression *arg;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  undefined1 in_stack_00000088 [16];
  Expression *expr;
  ASTSerializer *in_stack_ffffffffffffff80;
  ASTSerializer *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  in_stack_ffffffffffffffa0;
  
  name._M_str = (char *)in_stack_ffffffffffffff90;
  name._M_len = (size_t)in_RDI;
  ASTSerializer::writeProperty(in_stack_ffffffffffffff80,name);
  ASTSerializer::startObject((ASTSerializer *)0x3a938e);
  if (*(long *)(in_RCX + 8) != 0) {
    in_stack_ffffffffffffff80 = (ASTSerializer *)in_RDI->_M_ptr;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff90,
               (char *)in_RDI);
    ASTSerializer::writeLink
              ((ASTSerializer *)propName._M_str,(string_view)in_stack_00000088,
               (Symbol *)propName._M_len);
  }
  expr = (Expression *)in_RDI->_M_ptr;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff90,
             (char *)in_RDI);
  name_00._M_str = (char *)in_stack_ffffffffffffffa0._M_current;
  name_00._M_len = in_stack_ffffffffffffff98;
  ASTSerializer::startArray(in_stack_ffffffffffffff90,name_00);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)expr);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)expr);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator*((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                 *)&stack0xffffffffffffffa0);
    ASTSerializer::serialize(in_stack_ffffffffffffff80,expr);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffa0);
  }
  ASTSerializer::endArray((ASTSerializer *)0x3a9488);
  ASTSerializer::endObject((ASTSerializer *)0x3a9495);
  return;
}

Assistant:

void RandSeqProductionSymbol::serializeTo(ASTSerializer& serializer) const {
    auto writeItem = [&](std::string_view propName, const ProdItem& item) {
        serializer.writeProperty(propName);
        serializer.startObject();
        if (item.target)
            serializer.writeLink("target", *item.target);

        serializer.startArray("args");
        for (auto arg : item.args)
            serializer.serialize(*arg);
        serializer.endArray();

        serializer.endObject();
    };

    serializer.write("returnType", getReturnType());

    serializer.startArray("arguments");
    for (auto arg : arguments)
        serializer.serialize(*arg);
    serializer.endArray();

    serializer.startArray("rules");
    for (auto& rule : getRules()) {
        serializer.startObject();

        serializer.startArray("prods");
        for (auto prod : rule.prods) {
            serializer.startObject();
            switch (prod->kind) {
                case ProdKind::Item:
                    serializer.write("kind", "Item"sv);
                    writeItem("item", *(const ProdItem*)prod);
                    break;
                case ProdKind::CodeBlock:
                    serializer.write("kind", "CodeBlock"sv);
                    break;
                case ProdKind::IfElse: {
                    auto& iep = *(const IfElseProd*)prod;
                    serializer.write("kind", "IfElse"sv);
                    serializer.write("expr", *iep.expr);

                    writeItem("ifItem", iep.ifItem);
                    if (iep.elseItem)
                        writeItem("elseItem", *iep.elseItem);
                    break;
                }
                case ProdKind::Repeat: {
                    auto& rp = *(const RepeatProd*)prod;
                    serializer.write("kind", "Repeat"sv);
                    serializer.write("expr", *rp.expr);
                    writeItem("item", rp.item);
                    break;
                }
                case ProdKind::Case: {
                    auto& cp = *(const CaseProd*)prod;
                    serializer.write("kind", "Case"sv);
                    serializer.write("expr", *cp.expr);
                    if (cp.defaultItem)
                        writeItem("defaultItem", *cp.defaultItem);

                    serializer.startArray("items");
                    for (auto& item : cp.items) {
                        serializer.startObject();
                        serializer.startArray("expressions");
                        for (auto expr : item.expressions)
                            serializer.serialize(*expr);
                        serializer.endArray();

                        writeItem("item", item.item);
                        serializer.endObject();
                    }
                    serializer.endArray();
                    break;
                }
            }
            serializer.endObject();
        }
        serializer.endArray();

        if (rule.weightExpr)
            serializer.write("weightExpr", *rule.weightExpr);

        serializer.write("isRandJoin", rule.isRandJoin);
        if (rule.randJoinExpr)
            serializer.write("randJoinExpr", *rule.randJoinExpr);

        serializer.endObject();
    }
    serializer.endArray();
}